

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O0

void SHEvaluate(vec3f *w,int lmax,float *out)

{
  long lVar1;
  float *sout;
  float *cout;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  data_t dVar7;
  float fVar8;
  float c;
  float afStack_f0 [2];
  float *local_e8;
  float local_e0;
  float local_dc;
  float *local_d8;
  float *local_d0;
  float local_c4;
  float *local_c0;
  float *local_b8;
  float local_b0;
  float local_ac;
  float *local_a8;
  float local_9c;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float local_74;
  long local_70;
  bool local_61;
  int local_60;
  int local_5c;
  int m_2;
  int m_1;
  int l_1;
  int i_1;
  int i;
  float xyLen;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  int m;
  int l;
  unsigned_long __vla_expr0;
  float *local_20;
  float *out_local;
  vec3f *pvStack_10;
  int lmax_local;
  vec3f *w_local;
  
  local_20 = out;
  out_local._4_4_ = lmax;
  pvStack_10 = w;
  if (0x1c < lmax) {
    afStack_f0[0] = 2.76089e-39;
    afStack_f0[1] = 0.0;
    __assert_fail("lmax <= 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x84,"void SHEvaluate(const vec3f &, int, float *)");
  }
  afStack_f0[0] = 2.760903e-39;
  afStack_f0[1] = 0.0;
  dVar7 = norm(w);
  local_61 = false;
  if (0.995 < dVar7) {
    afStack_f0[0] = 2.76094e-39;
    afStack_f0[1] = 0.0;
    dVar7 = norm(pvStack_10);
    local_61 = dVar7 < 1.005;
  }
  if (local_61 == false) {
    afStack_f0[0] = 2.761027e-39;
    afStack_f0[1] = 0.0;
    __assert_fail("norm(w) > .995f && norm(w) < 1.005f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x8c,"void SHEvaluate(const vec3f &, int, float *)");
  }
  afStack_f0[0] = 2.761057e-39;
  afStack_f0[1] = 0.0;
  legendrep(pvStack_10->z,out_local._4_4_,local_20);
  afStack_f0[0] = 2.761068e-39;
  afStack_f0[1] = 0.0;
  uVar2 = SHTerms(out_local._4_4_);
  _m = (ulong)uVar2;
  lVar1 = -(_m * 4 + 0xf & 0xfffffffffffffff0);
  local_70 = (long)&local_e8 + lVar1;
  __vla_expr0 = (unsigned_long)&local_e8;
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ <= out_local._4_4_;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    for (__vla_expr1._0_4_ = -__vla_expr1._4_4_; iVar5 = __vla_expr1._4_4_, iVar3 = (int)__vla_expr1
        , (int)__vla_expr1 <= __vla_expr1._4_4_; __vla_expr1._0_4_ = (int)__vla_expr1 + 1) {
      *(undefined8 *)((long)afStack_f0 + lVar1) = 0x1e110c;
      local_74 = K(iVar5,iVar3);
      iVar5 = __vla_expr1._4_4_;
      iVar3 = (int)__vla_expr1;
      *(undefined8 *)((long)afStack_f0 + lVar1) = 0x1e111c;
      iVar3 = SHIndex(iVar5,iVar3);
      *(float *)(local_70 + (long)iVar3 * 4) = local_74;
    }
  }
  __vla_expr2 = (unsigned_long)(out_local._4_4_ + 1);
  local_88 = (float *)(((long)&local_e8 + lVar1) - (__vla_expr2 * 4 + 0xf & 0xfffffffffffffff0));
  _i = (ulong)(out_local._4_4_ + 1);
  pfVar6 = (float *)((long)local_88 - (_i * 4 + 0xf & 0xfffffffffffffff0));
  fVar8 = -pvStack_10->z * pvStack_10->z + 1.0;
  if (fVar8 <= 0.0) {
    fVar8 = 0.0;
  }
  local_80 = pfVar6;
  pfVar6[-2] = 2.761452e-39;
  pfVar6[-1] = 0.0;
  i_1 = (int)sqrtf(fVar8);
  cout = local_80;
  sout = local_88;
  if (((float)i_1 != 0.0) || (NAN((float)i_1))) {
    fVar8 = pvStack_10->y / (float)i_1;
    c = pvStack_10->x / (float)i_1;
    iVar3 = out_local._4_4_ + 1;
    pfVar6[-2] = 2.761672e-39;
    pfVar6[-1] = 0.0;
    sinCosIndexed(fVar8,c,iVar3,sout,cout);
  }
  else {
    for (l_1 = 0; l_1 <= out_local._4_4_; l_1 = l_1 + 1) {
      local_88[l_1] = 0.0;
    }
    for (m_1 = 0; m_1 <= out_local._4_4_; m_1 = m_1 + 1) {
      local_80[m_1] = 1.0;
    }
  }
  if (SHEvaluate(vec3f_const&,int,float*)::sqrt2 == '\0') {
    pfVar6[-2] = 2.761701e-39;
    pfVar6[-1] = 0.0;
    iVar3 = __cxa_guard_acquire(&SHEvaluate(vec3f_const&,int,float*)::sqrt2);
    if (iVar3 != 0) {
      pfVar6[-2] = 2.761727e-39;
      pfVar6[-1] = 0.0;
      SHEvaluate::sqrt2 = sqrtf(2.0);
      pfVar6[-2] = 2.761755e-39;
      pfVar6[-1] = 0.0;
      __cxa_guard_release(&SHEvaluate(vec3f_const&,int,float*)::sqrt2);
    }
  }
  m_2 = 0;
  do {
    if (out_local._4_4_ < m_2) {
      return;
    }
    for (local_5c = -m_2; iVar5 = m_2, iVar3 = local_5c, local_5c < 0; local_5c = local_5c + 1) {
      local_b0 = SHEvaluate::sqrt2;
      pfVar6[-2] = 2.761844e-39;
      pfVar6[-1] = 0.0;
      iVar3 = SHIndex(iVar5,iVar3);
      iVar5 = m_2;
      local_ac = local_b0 * *(float *)(local_70 + (long)iVar3 * 4);
      local_a8 = local_20;
      iVar3 = -local_5c;
      pfVar6[-2] = 2.76192e-39;
      pfVar6[-1] = 0.0;
      iVar4 = SHIndex(iVar5,iVar3);
      iVar5 = m_2;
      iVar3 = local_5c;
      local_9c = local_ac * local_a8[iVar4] * local_88[-local_5c];
      local_98 = local_20;
      pfVar6[-2] = 2.762021e-39;
      pfVar6[-1] = 0.0;
      iVar4 = SHIndex(iVar5,iVar3);
      iVar5 = m_2;
      iVar3 = local_5c;
      local_98[iVar4] = local_9c;
      local_90 = local_20;
      pfVar6[-2] = 2.762087e-39;
      pfVar6[-1] = 0.0;
      iVar3 = SHIndex(iVar5,iVar3);
      fVar8 = local_90[iVar3];
      pfVar6[-2] = 2.762118e-39;
      pfVar6[-1] = 0.0;
      iVar4 = std::isnan((double)(ulong)(uint)fVar8);
      iVar5 = m_2;
      iVar3 = local_5c;
      if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
        pfVar6[-2] = 2.762175e-39;
        pfVar6[-1] = 0.0;
        __assert_fail("!isnan(out[SHIndex(l,m)])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                      ,0xa6,"void SHEvaluate(const vec3f &, int, float *)");
      }
      local_b8 = local_20;
      pfVar6[-2] = 2.762206e-39;
      pfVar6[-1] = 0.0;
      iVar3 = SHIndex(iVar5,iVar3);
      fVar8 = local_b8[iVar3];
      pfVar6[-2] = 2.762237e-39;
      pfVar6[-1] = 0.0;
      iVar3 = std::isinf((double)(ulong)(uint)fVar8);
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
        pfVar6[-2] = 2.762294e-39;
        pfVar6[-1] = 0.0;
        __assert_fail("!isinf(out[SHIndex(l,m)])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                      ,0xa7,"void SHEvaluate(const vec3f &, int, float *)");
      }
    }
    pfVar6[-2] = 2.76233e-39;
    pfVar6[-1] = 0.0;
    iVar5 = SHIndex(iVar5,0);
    iVar3 = m_2;
    local_c4 = *(float *)(local_70 + (long)iVar5 * 4);
    local_c0 = local_20;
    pfVar6[-2] = 2.762391e-39;
    pfVar6[-1] = 0.0;
    iVar3 = SHIndex(iVar3,0);
    local_c0[iVar3] = local_c4 * local_c0[iVar3];
    for (local_60 = 1; iVar5 = m_2, iVar3 = local_60, local_60 <= m_2; local_60 = local_60 + 1) {
      local_e0 = SHEvaluate::sqrt2;
      pfVar6[-2] = 2.762497e-39;
      pfVar6[-1] = 0.0;
      iVar4 = SHIndex(iVar5,iVar3);
      iVar5 = m_2;
      iVar3 = local_60;
      local_dc = local_e0 * *(float *)(local_70 + (long)iVar4 * 4) * local_80[local_60];
      local_d8 = local_20;
      pfVar6[-2] = 2.762588e-39;
      pfVar6[-1] = 0.0;
      iVar4 = SHIndex(iVar5,iVar3);
      iVar5 = m_2;
      iVar3 = local_60;
      local_d8[iVar4] = local_dc * local_d8[iVar4];
      local_d0 = local_20;
      pfVar6[-2] = 2.762661e-39;
      pfVar6[-1] = 0.0;
      iVar3 = SHIndex(iVar5,iVar3);
      fVar8 = local_d0[iVar3];
      pfVar6[-2] = 2.762692e-39;
      pfVar6[-1] = 0.0;
      iVar4 = std::isnan((double)(ulong)(uint)fVar8);
      iVar5 = m_2;
      iVar3 = local_60;
      if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
        pfVar6[-2] = 2.76275e-39;
        pfVar6[-1] = 0.0;
        __assert_fail("!isnan(out[SHIndex(l,m)])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                      ,0xad,"void SHEvaluate(const vec3f &, int, float *)");
      }
      local_e8 = local_20;
      pfVar6[-2] = 2.76278e-39;
      pfVar6[-1] = 0.0;
      iVar3 = SHIndex(iVar5,iVar3);
      fVar8 = local_e8[iVar3];
      pfVar6[-2] = 2.762811e-39;
      pfVar6[-1] = 0.0;
      iVar3 = std::isinf((double)(ulong)(uint)fVar8);
      if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
        pfVar6[-2] = 2.762869e-39;
        pfVar6[-1] = 0.0;
        __assert_fail("!isinf(out[SHIndex(l,m)])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                      ,0xae,"void SHEvaluate(const vec3f &, int, float *)");
      }
    }
    m_2 = m_2 + 1;
  } while( true );
}

Assistant:

void SHEvaluate(const vec3f &w, int lmax, float *out) {
    assert(lmax <= 28);
    // if (lmax > 28) {
    //     console.error("SHEvaluate() runs out of numerical precision for lmax > 28. "
    //            "If you need more bands, try recompiling using doubles.");
    //     exit(1);
    // }

    // Compute Legendre polynomial values for $\cos\theta$
    assert(norm(w) > .995f && norm(w) < 1.005f);
    legendrep(w.z, lmax, out);

    // Compute $K_l^m$ coefficients
    float Klm[SHTerms(lmax)];
    for (int l = 0; l <= lmax; ++l)
        for (int m = -l; m <= l; ++m)
            Klm[SHIndex(l, m)] = K(l, m);

    // Compute $\sin\phi$ and $\cos\phi$ values
    float sins[lmax+1], coss[lmax+1];
    float xyLen = sqrtf(fmax(0.f, 1.f - w.z*w.z));
    if (xyLen == 0.f) {
        for (int i = 0; i <= lmax; ++i) sins[i] = 0.f;
        for (int i = 0; i <= lmax; ++i) coss[i] = 1.f;
    }
    else
        sinCosIndexed(w.y / xyLen, w.x / xyLen, lmax+1, sins, coss);

    // Apply SH definitions to compute final $(l,m)$ values
    static const float sqrt2 = sqrtf(2.f);
    for (int l = 0; l <= lmax; ++l) {
        for (int m = -l; m < 0; ++m)
        {
            out[SHIndex(l, m)] = sqrt2 * Klm[SHIndex(l, m)] *
                out[SHIndex(l, -m)] * sins[-m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
        out[SHIndex(l, 0)] *= Klm[SHIndex(l, 0)];
        for (int m = 1; m <= l; ++m)
        {
            out[SHIndex(l, m)] *= sqrt2 * Klm[SHIndex(l, m)] * coss[m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
    }
}